

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O0

void __thiscall
tl::Vector<glm::vec<3,float,(glm::qualifier)0>>::emplace_back<int,int,float>
          (Vector<glm::vec<3,float,(glm::qualifier)0>> *this,int *args,int *args_1,float *args_2)

{
  int _x;
  int _y;
  long lVar1;
  long lVar2;
  int *piVar3;
  float *pfVar4;
  float *args_local_2;
  int *args_local_1;
  int *args_local;
  Vector<glm::vec<3,_float,_(glm::qualifier)0>_> *this_local;
  
  if (*(long *)(this + 8) == *(long *)(this + 0x10)) {
    Vector<glm::vec<3,_float,_(glm::qualifier)0>_>::grow
              ((Vector<glm::vec<3,_float,_(glm::qualifier)0>_> *)this,*(long *)(this + 0x10) + 1);
  }
  lVar1 = *(long *)this;
  lVar2 = *(long *)(this + 8);
  piVar3 = forward<int>(args);
  _x = *piVar3;
  piVar3 = forward<int>(args_1);
  _y = *piVar3;
  pfVar4 = forward<float>(args_2);
  glm::vec<3,float,(glm::qualifier)0>::vec<int,int,float>
            ((vec<3,float,(glm::qualifier)0> *)(lVar1 + lVar2 * 0xc),_x,_y,*pfVar4);
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  return;
}

Assistant:

void Vector<T>::emplace_back(Args&&... args)noexcept
{
    if(_size == _capacity)
        grow(_capacity+1);
    new ((void*)&_data[_size]) T(tl::forward<Args>(args)...);
    _size++;
}